

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_unziphi_8(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  c_v128 cVar8;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = a.u64[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = b.u64[1];
  auVar5 = vpunpcklqdq_avx(auVar5,auVar4);
  auVar4 = vpand_avx(auVar5,_DAT_00c1e240);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = a.u64[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = b.u64[0];
  auVar3 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar6 = vpshufb_avx(auVar5,_DAT_00c224f0);
  auVar7 = vpshufb_avx(auVar5,_DAT_00c22500);
  auVar1 = vpshufb_avx(auVar5,_DAT_00c22510);
  auVar5 = vpshufb_avx(auVar3,_DAT_00c22520);
  auVar2 = vpshufb_avx(auVar3,_DAT_00c22530);
  auVar4 = vpor_avx(auVar5,auVar4);
  auVar5 = vpshufb_avx(auVar3,_DAT_00c22540);
  auVar5 = vpor_avx(auVar2,auVar5);
  auVar4 = vpor_avx(auVar4,auVar5);
  auVar5 = vpshufb_avx(auVar3,_DAT_00c22550);
  auVar5 = vpor_avx(auVar5,auVar6);
  auVar5 = vpor_avx(auVar5,auVar7);
  auVar4 = vpor_avx(auVar4,auVar5);
  auVar4 = vpor_avx(auVar4,auVar1);
  cVar8._8_8_ = vpextrq_avx(auVar4,1);
  cVar8.u64[0] = auVar4._0_8_;
  return cVar8;
}

Assistant:

SIMD_INLINE c_v128 _c_v128_unzip_8(c_v128 a, c_v128 b, int mode) {
  c_v128 t;
  if (mode) {
    t.u8[15] = b.u8[15];
    t.u8[14] = b.u8[13];
    t.u8[13] = b.u8[11];
    t.u8[12] = b.u8[9];
    t.u8[11] = b.u8[7];
    t.u8[10] = b.u8[5];
    t.u8[9] = b.u8[3];
    t.u8[8] = b.u8[1];
    t.u8[7] = a.u8[15];
    t.u8[6] = a.u8[13];
    t.u8[5] = a.u8[11];
    t.u8[4] = a.u8[9];
    t.u8[3] = a.u8[7];
    t.u8[2] = a.u8[5];
    t.u8[1] = a.u8[3];
    t.u8[0] = a.u8[1];
  } else {
    t.u8[15] = a.u8[14];
    t.u8[14] = a.u8[12];
    t.u8[13] = a.u8[10];
    t.u8[12] = a.u8[8];
    t.u8[11] = a.u8[6];
    t.u8[10] = a.u8[4];
    t.u8[9] = a.u8[2];
    t.u8[8] = a.u8[0];
    t.u8[7] = b.u8[14];
    t.u8[6] = b.u8[12];
    t.u8[5] = b.u8[10];
    t.u8[4] = b.u8[8];
    t.u8[3] = b.u8[6];
    t.u8[2] = b.u8[4];
    t.u8[1] = b.u8[2];
    t.u8[0] = b.u8[0];
  }
  return t;
}